

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall mkvmuxer::Segment::UpdateDocTypeVersion(Segment *this)

{
  Track **ppTVar1;
  Track *pTVar2;
  uint32_t index;
  ulong uVar3;
  
  ppTVar1 = (this->tracks_).track_entries_;
  uVar3 = 0;
  do {
    if ((this->tracks_).track_entries_size_ <= uVar3) {
      return;
    }
    if (ppTVar1 == (Track **)0x0) {
      return;
    }
    pTVar2 = ppTVar1[uVar3];
    if (pTVar2 == (Track *)0x0) {
      return;
    }
    if (pTVar2->codec_delay_ == 0) {
      if (pTVar2->seek_pre_roll_ != 0 && this->doc_type_version_ < 4) goto LAB_0014e232;
    }
    else if (this->doc_type_version_ < 4) {
LAB_0014e232:
      this->doc_type_version_ = 4;
      return;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void Segment::UpdateDocTypeVersion() {
  for (uint32_t index = 0; index < tracks_.track_entries_size(); ++index) {
    const Track* track = tracks_.GetTrackByIndex(index);
    if (track == NULL)
      break;
    if ((track->codec_delay() || track->seek_pre_roll()) &&
        doc_type_version_ < 4) {
      doc_type_version_ = 4;
      break;
    }
  }
}